

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O1

uint If_ManSatCheckXYall_int(void *pSat,int nLutSize,word *pTruth,int nVars,Vec_Int_t *vLits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  char cVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long local_78;
  ulong local_70;
  ulong local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  Vec_Int_t *local_48;
  word *local_40;
  ulong local_38;
  
  if (4 < nLutSize - 2U) {
    __assert_fail("nLutSize >= 2 && nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0x10d,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  if ((nVars <= nLutSize) || (nLutSize * 2 <= nVars)) {
    __assert_fail("nLutSize < nVars && nVars <= nTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0x10e,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  iVar3 = ~nVars + nLutSize * 2;
  if ((iVar3 < 0) || (nLutSize + -1 <= iVar3)) {
    __assert_fail("nShared >= 0 && nShared < nLutSize - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0x10f,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  switch(nLutSize - 2U) {
  case 0:
    if (iVar3 != 0) {
      __assert_fail("nShared == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                    ,0x112,
                    "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
    }
    local_98 = 0;
    if (nVars < 1) {
      uVar9 = 0;
    }
    else {
      local_94 = 0;
      do {
        while (local_94 = local_94 + 1, nVars <= local_94) {
          local_94 = local_98 + 1;
          local_98 = local_94;
          if (nVars <= local_94) {
            return 0;
          }
        }
        uVar9 = 1 << ((char)local_98 * '\x02' & 0x1fU) | 1 << (local_94 * 2 & 0x1fU);
        iVar3 = If_ManSatCheckXY(pSat,2,pTruth,nVars,uVar9,(word *)0x0,(word *)0x0,vLits);
      } while (iVar3 == 0);
    }
    break;
  case 1:
    local_98 = 0;
    if (0 < nVars) {
      local_94 = 0;
      do {
        while (local_94 + 1 < nVars) {
          local_90 = local_94 + 2;
          local_94 = local_94 + 1;
          for (; local_90 < nVars; local_90 = local_90 + 1) {
            uVar9 = 1 << ((char)local_98 * '\x02' & 0x1fU) | 1 << (local_90 * 2 & 0x1fU) |
                    1 << ((byte)((char)local_94 * '\x02') & 0x1f);
            iVar2 = If_ManSatCheckXY(pSat,3,pTruth,nVars,uVar9,(word *)0x0,(word *)0x0,vLits);
            if (iVar2 != 0) {
              return uVar9;
            }
          }
        }
        local_94 = local_98 + 1;
        local_98 = local_94;
      } while (local_94 < nVars);
    }
    uVar9 = 0;
    if ((iVar3 != 0) && (local_98 = 0, 0 < nVars)) {
      iVar3 = 0;
      do {
        while (local_94 = iVar3 + 1, iVar3 + 1 < nVars) {
          for (local_90 = iVar3 + 2; iVar3 = local_94, local_90 < nVars; local_90 = local_90 + 1) {
            uVar11 = 1 << ((char)local_98 * '\x02' & 0x1fU) | 1 << (local_90 * 2 & 0x1fU) |
                     1 << ((byte)((char)local_94 * '\x02') & 0x1f);
            lVar8 = 0;
            do {
              iVar3 = If_ManSatCheckXY(pSat,3,pTruth,nVars,
                                       3 << ((char)(&local_98)[lVar8] * '\x02' & 0x1fU) | uVar11,
                                       (word *)0x0,(word *)0x0,vLits);
              if (iVar3 != 0) {
                cVar6 = (char)(&local_98)[lVar8];
                goto LAB_00434412;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
          }
        }
        local_98 = local_98 + 1;
        uVar9 = 0;
        iVar3 = local_98;
      } while (local_98 < nVars);
    }
    break;
  case 2:
    local_98 = 0;
    if (0 < nVars) {
      local_94 = 0;
      do {
        while (local_94 + 1 < nVars) {
          local_8c = local_94 + 2;
          local_94 = local_94 + 1;
          while (local_90 = local_8c, local_8c < nVars) {
            while (local_8c = local_8c + 1, local_8c < nVars) {
              uVar9 = 1 << ((char)local_98 * '\x02' & 0x1fU) | 1 << (local_8c * 2 & 0x1fU) |
                      1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                      1 << ((byte)((char)local_90 * '\x02') & 0x1f);
              iVar2 = If_ManSatCheckXY(pSat,4,pTruth,nVars,uVar9,(word *)0x0,(word *)0x0,vLits);
              if (iVar2 != 0) {
                return uVar9;
              }
            }
            local_8c = local_90 + 1;
          }
        }
        local_94 = local_98 + 1;
        local_98 = local_94;
      } while (local_94 < nVars);
    }
    uVar9 = 0;
    if (iVar3 != 0) {
      local_98 = 0;
      if (0 < nVars) {
        iVar2 = 0;
        do {
          while (local_94 = iVar2 + 1, iVar2 + 1 < nVars) {
            for (local_90 = iVar2 + 2; iVar2 = local_94, local_90 < nVars; local_90 = local_90 + 1)
            {
              local_8c = local_90 + 1;
              if (local_8c < nVars) {
                local_60 = pSat;
                local_78 = CONCAT44(local_78._4_4_,iVar3);
                do {
                  uVar11 = 1 << ((char)local_98 * '\x02' & 0x1fU) | 1 << (local_8c * 2 & 0x1fU) |
                           1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                           1 << ((byte)((char)local_90 * '\x02') & 0x1f);
                  lVar8 = 0;
                  do {
                    iVar3 = If_ManSatCheckXY(local_60,4,pTruth,nVars,
                                             3 << ((char)(&local_98)[lVar8] * '\x02' & 0x1fU) |
                                             uVar11,(word *)0x0,(word *)0x0,vLits);
                    if (iVar3 != 0) goto LAB_00434404;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 4);
                  local_8c = local_8c + 1;
                  pSat = local_60;
                  iVar3 = (uint)local_78;
                } while (local_8c < nVars);
              }
            }
          }
          local_98 = local_98 + 1;
          iVar2 = local_98;
        } while (local_98 < nVars);
      }
      if ((1 < iVar3) && (local_98 = 0, 0 < nVars)) {
        iVar3 = 0;
        do {
          while (local_94 = iVar3 + 1, iVar3 + 1 < nVars) {
            local_8c = iVar3 + 2;
            while (local_90 = local_8c, iVar3 = local_94, local_8c < nVars) {
              while( true ) {
                local_8c = local_8c + 1;
                if (nVars <= local_8c) break;
                local_70 = CONCAT44(local_70._4_4_,
                                    1 << ((char)local_98 * '\x02' & 0x1fU) |
                                    1 << (local_8c * 2 & 0x1fU) |
                                    1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                                    1 << ((byte)((char)local_90 * '\x02') & 0x1f));
                lVar8 = 1;
                uVar4 = 0;
                do {
                  local_78 = lVar8;
                  if (uVar4 < 3) {
                    do {
                      iVar3 = If_ManSatCheckXY(pSat,4,pTruth,nVars,
                                               3 << ((char)(&local_98)[lVar8] * '\x02' & 0x1fU) |
                                               3 << ((char)(&local_98)[uVar4] * '\x02' & 0x1fU) |
                                               (uint)local_70,(word *)0x0,(word *)0x0,vLits);
                      if (iVar3 != 0) {
                        cVar6 = (char)(&local_98)[uVar4];
LAB_0043483e:
                        cVar7 = (char)(&local_98)[lVar8];
LAB_00434851:
                        return 3 << (cVar7 * '\x02' & 0x1fU) | 3 << (cVar6 * '\x02' & 0x1fU) |
                               (uint)local_70;
                      }
                      lVar8 = lVar8 + 1;
                    } while (lVar8 != 4);
                  }
                  uVar4 = uVar4 + 1;
                  lVar8 = local_78 + 1;
                } while (uVar4 != 4);
              }
              local_8c = local_90 + 1;
            }
          }
          local_98 = local_98 + 1;
          uVar9 = 0;
          iVar3 = local_98;
        } while (local_98 < nVars);
      }
    }
    break;
  case 3:
    local_98 = 0;
    if (0 < nVars) {
      local_94 = 0;
      do {
        while (local_94 + 1 < nVars) {
          local_8c = local_94 + 2;
          local_94 = local_94 + 1;
          while (local_90 = local_8c, local_8c < nVars) {
            while (local_8c + 1 < nVars) {
              local_88 = local_8c + 2;
              local_8c = local_8c + 1;
              for (; local_88 < nVars; local_88 = local_88 + 1) {
                uVar9 = 1 << ((char)local_98 * '\x02' & 0x1fU) | 1 << (local_88 * 2 & 0x1fU) |
                        1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                        1 << ((byte)((char)local_90 * '\x02') & 0x1f) |
                        1 << ((byte)((char)local_8c * '\x02') & 0x1f);
                iVar2 = If_ManSatCheckXY(pSat,5,pTruth,nVars,uVar9,(word *)0x0,(word *)0x0,vLits);
                if (iVar2 != 0) {
                  return uVar9;
                }
              }
            }
            local_8c = local_90 + 1;
          }
        }
        local_94 = local_98 + 1;
        local_98 = local_94;
      } while (local_94 < nVars);
    }
    uVar9 = 0;
    if (iVar3 != 0) {
      local_98 = 0;
      if (0 < nVars) {
        iVar2 = 0;
        do {
          while (local_94 = iVar2 + 1, iVar2 + 1 < nVars) {
            for (local_90 = iVar2 + 2; iVar1 = local_90, iVar2 = local_94, local_90 < nVars;
                local_90 = local_90 + 1) {
              while (local_8c = iVar1 + 1, iVar1 + 1 < nVars) {
                local_88 = iVar1 + 2;
                iVar1 = local_8c;
                if (local_88 < nVars) {
                  local_60 = pSat;
                  local_78 = CONCAT44(local_78._4_4_,iVar3);
                  do {
                    uVar11 = 1 << ((char)local_98 * '\x02' & 0x1fU) | 1 << (local_88 * 2 & 0x1fU) |
                             1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                             1 << ((byte)((char)local_90 * '\x02') & 0x1f) |
                             1 << ((byte)((char)local_8c * '\x02') & 0x1f);
                    lVar8 = 0;
                    do {
                      iVar3 = If_ManSatCheckXY(local_60,5,pTruth,nVars,
                                               3 << ((char)(&local_98)[lVar8] * '\x02' & 0x1fU) |
                                               uVar11,(word *)0x0,(word *)0x0,vLits);
                      if (iVar3 != 0) goto LAB_00434404;
                      lVar8 = lVar8 + 1;
                    } while (lVar8 != 5);
                    local_88 = local_88 + 1;
                    pSat = local_60;
                    iVar1 = local_8c;
                    iVar3 = (uint)local_78;
                  } while (local_88 < nVars);
                }
              }
            }
          }
          local_98 = local_98 + 1;
          iVar2 = local_98;
        } while (local_98 < nVars);
      }
      if (1 < iVar3) {
        local_98 = 0;
        if (0 < nVars) {
          iVar2 = 0;
          do {
            while (local_94 = iVar2 + 1, iVar2 + 1 < nVars) {
              for (local_90 = iVar2 + 2; iVar1 = local_90, iVar2 = local_94, local_90 < nVars;
                  local_90 = local_90 + 1) {
                while (local_8c = iVar1 + 1, iVar1 + 1 < nVars) {
                  local_88 = iVar1 + 2;
                  iVar1 = local_8c;
                  if (local_88 < nVars) {
                    local_78 = CONCAT44(local_78._4_4_,iVar3);
                    local_40 = pTruth;
                    do {
                      local_70 = CONCAT44(local_70._4_4_,
                                          1 << ((char)local_98 * '\x02' & 0x1fU) |
                                          1 << (local_88 * 2 & 0x1fU) |
                                          1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                                          1 << ((byte)((char)local_90 * '\x02') & 0x1f) |
                                          1 << ((byte)((char)local_8c * '\x02') & 0x1f));
                      uVar4 = 0;
                      do {
                        uVar5 = uVar4;
                        if (uVar4 < 4) {
                          do {
                            iVar3 = If_ManSatCheckXY(pSat,5,local_40,nVars,
                                                     3 << ((char)(&local_94)[uVar5] * '\x02' & 0x1fU
                                                          ) | 3 << ((char)(&local_98)[uVar4] *
                                                                    '\x02' & 0x1fU) | (uint)local_70
                                                     ,(word *)0x0,(word *)0x0,vLits);
                            if (iVar3 != 0) {
                              cVar6 = (char)(&local_98)[uVar4];
                              cVar7 = (char)(&local_94)[uVar5];
                              goto LAB_00434851;
                            }
                            uVar5 = uVar5 + 1;
                          } while (uVar5 != 4);
                        }
                        uVar4 = uVar4 + 1;
                      } while (uVar4 != 5);
                      local_88 = local_88 + 1;
                      pTruth = local_40;
                      iVar1 = local_8c;
                      iVar3 = (uint)local_78;
                    } while (local_88 < nVars);
                  }
                }
              }
            }
            local_98 = local_98 + 1;
            iVar2 = local_98;
          } while (local_98 < nVars);
        }
        if ((iVar3 != 2) && (local_98 = 0, 0 < nVars)) {
          iVar3 = 0;
          do {
            while (local_94 = iVar3 + 1, iVar3 + 1 < nVars) {
              for (local_90 = iVar3 + 2; iVar3 = local_94, iVar2 = local_90, local_90 < nVars;
                  local_90 = local_90 + 1) {
                while (local_8c = iVar2 + 1, iVar2 + 1 < nVars) {
                  for (local_88 = iVar2 + 2; iVar2 = local_8c, local_88 < nVars;
                      local_88 = local_88 + 1) {
                    local_78 = CONCAT44(local_78._4_4_,
                                        1 << ((char)local_98 * '\x02' & 0x1fU) |
                                        1 << (local_88 * 2 & 0x1fU) |
                                        1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                                        1 << ((byte)((char)local_90 * '\x02') & 0x1f) |
                                        1 << ((byte)((char)local_8c * '\x02') & 0x1f));
                    uVar4 = 1;
                    uVar5 = 0;
                    do {
                      local_68 = uVar4;
                      if (uVar5 < 4) {
                        do {
                          local_70 = uVar4;
                          for (; uVar4 < 4; uVar4 = uVar4 + 1) {
                            iVar3 = If_ManSatCheckXY(pSat,5,pTruth,nVars,
                                                     3 << ((char)(&local_94)[uVar4] * '\x02' & 0x1fU
                                                          ) | (uint)local_78 |
                                                     3 << ((char)(&local_98)[local_70] * '\x02' &
                                                          0x1fU) |
                                                     3 << ((char)(&local_98)[uVar5] * '\x02' & 0x1fU
                                                          ),(word *)0x0,(word *)0x0,vLits);
                            if (iVar3 != 0) {
                              uVar9 = 3 << ((char)(&local_98)[local_70] * '\x02' & 0x1fU) |
                                      3 << ((char)(&local_98)[uVar5] * '\x02' & 0x1fU);
                              local_58._0_4_ =
                                   3 << ((char)(&local_94)[uVar4] * '\x02' & 0x1fU) | (uint)local_78
                              ;
LAB_00434c06:
                              return (uint)local_58 | uVar9;
                            }
                          }
                          uVar4 = local_70 + 1;
                        } while (uVar4 != 5);
                      }
                      uVar5 = uVar5 + 1;
                      uVar4 = local_68 + 1;
                    } while (uVar5 != 5);
                  }
                }
              }
            }
            local_98 = local_98 + 1;
            uVar9 = 0;
            iVar3 = local_98;
          } while (local_98 < nVars);
        }
      }
    }
    break;
  default:
    local_98 = 0;
    if (0 < nVars) {
      local_94 = 0;
      do {
        while (local_94 + 1 < nVars) {
          local_8c = local_94 + 2;
          local_94 = local_94 + 1;
          while (local_90 = local_8c, local_8c < nVars) {
            while (local_8c + 1 < nVars) {
              local_84 = local_8c + 2;
              local_8c = local_8c + 1;
              while (local_88 = local_84, local_84 < nVars) {
                while (local_84 = local_84 + 1, local_84 < nVars) {
                  uVar9 = 1 << ((char)local_98 * '\x02' & 0x1fU) | 1 << (local_84 * 2 & 0x1fU) |
                          1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                          1 << ((byte)((char)local_90 * '\x02') & 0x1f) |
                          1 << ((byte)((char)local_8c * '\x02') & 0x1f) |
                          1 << ((byte)((char)local_88 * '\x02') & 0x1f);
                  iVar2 = If_ManSatCheckXY(pSat,6,pTruth,nVars,uVar9,(word *)0x0,(word *)0x0,vLits);
                  if (iVar2 != 0) {
                    return uVar9;
                  }
                }
                local_84 = local_88 + 1;
              }
            }
            local_8c = local_90 + 1;
          }
        }
        local_94 = local_98 + 1;
        local_98 = local_94;
      } while (local_94 < nVars);
    }
    uVar10 = 0;
    uVar9 = 0;
    if (iVar3 != 0) {
      local_98 = 0;
      if (0 < nVars) {
        iVar2 = 0;
        do {
          while (local_94 = iVar2 + 1, iVar2 + 1 < nVars) {
            for (local_90 = iVar2 + 2; iVar1 = local_90, iVar2 = local_94, local_90 < nVars;
                local_90 = local_90 + 1) {
              while (local_8c = iVar1 + 1, iVar1 + 1 < nVars) {
                for (local_88 = iVar1 + 2; iVar1 = local_8c, local_88 < nVars;
                    local_88 = local_88 + 1) {
                  local_84 = local_88 + 1;
                  if (local_84 < nVars) {
                    local_60 = pSat;
                    local_78 = CONCAT44(local_78._4_4_,iVar3);
                    do {
                      uVar11 = 1 << ((char)local_98 * '\x02' & 0x1fU) | 1 << (local_84 * 2 & 0x1fU)
                               | 1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                               1 << ((byte)((char)local_90 * '\x02') & 0x1f) |
                               1 << ((byte)((char)local_8c * '\x02') & 0x1f) |
                               1 << ((byte)((char)local_88 * '\x02') & 0x1f);
                      lVar8 = 0;
                      do {
                        iVar3 = If_ManSatCheckXY(local_60,6,pTruth,nVars,
                                                 3 << ((char)(&local_98)[lVar8] * '\x02' & 0x1fU) |
                                                 uVar11,(word *)0x0,(word *)0x0,vLits);
                        if (iVar3 != 0) goto LAB_00434404;
                        lVar8 = lVar8 + 1;
                      } while (lVar8 != 6);
                      local_84 = local_84 + 1;
                      pSat = local_60;
                      iVar3 = (uint)local_78;
                    } while (local_84 < nVars);
                  }
                }
              }
            }
          }
          local_98 = local_98 + 1;
          iVar2 = local_98;
        } while (local_98 < nVars);
      }
      uVar9 = uVar10;
      if (1 < iVar3) {
        local_98 = 0;
        if (0 < nVars) {
          iVar2 = 0;
          do {
            while (local_94 = iVar2 + 1, iVar2 + 1 < nVars) {
              for (local_90 = iVar2 + 2; iVar1 = local_90, iVar2 = local_94, local_90 < nVars;
                  local_90 = local_90 + 1) {
                while (local_8c = iVar1 + 1, iVar1 + 1 < nVars) {
                  for (local_88 = iVar1 + 2; iVar1 = local_8c, local_88 < nVars;
                      local_88 = local_88 + 1) {
                    local_84 = local_88 + 1;
                    if (local_84 < nVars) {
                      local_78 = CONCAT44(local_78._4_4_,iVar3);
                      local_48 = vLits;
                      do {
                        local_70 = CONCAT44(local_70._4_4_,
                                            1 << ((char)local_98 * '\x02' & 0x1fU) |
                                            1 << (local_84 * 2 & 0x1fU) |
                                            1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                                            1 << ((byte)((char)local_90 * '\x02') & 0x1f) |
                                            1 << ((byte)((char)local_8c * '\x02') & 0x1f) |
                                            1 << ((byte)((char)local_88 * '\x02') & 0x1f));
                        lVar8 = 1;
                        uVar4 = 0;
                        do {
                          local_68 = lVar8;
                          if (uVar4 < 5) {
                            do {
                              iVar3 = If_ManSatCheckXY(pSat,6,pTruth,nVars,
                                                       3 << ((char)(&local_98)[lVar8] * '\x02' &
                                                            0x1fU) |
                                                       3 << ((char)(&local_98)[uVar4] * '\x02' &
                                                            0x1fU) | (uint)local_70,(word *)0x0,
                                                       (word *)0x0,local_48);
                              if (iVar3 != 0) {
                                cVar6 = (char)(&local_98)[uVar4];
                                goto LAB_0043483e;
                              }
                              lVar8 = lVar8 + 1;
                            } while (lVar8 != 6);
                          }
                          uVar4 = uVar4 + 1;
                          lVar8 = local_68 + 1;
                        } while (uVar4 != 6);
                        local_84 = local_84 + 1;
                        vLits = local_48;
                        iVar3 = (uint)local_78;
                      } while (local_84 < nVars);
                    }
                  }
                }
              }
            }
            local_98 = local_98 + 1;
            iVar2 = local_98;
          } while (local_98 < nVars);
        }
        if (iVar3 != 2) {
          local_98 = 0;
          if (0 < nVars) {
            iVar2 = 0;
            do {
              while (local_94 = iVar2 + 1, iVar2 + 1 < nVars) {
                for (local_90 = iVar2 + 2; iVar1 = local_90, iVar2 = local_94, local_90 < nVars;
                    local_90 = local_90 + 1) {
                  while (local_8c = iVar1 + 1, iVar1 + 1 < nVars) {
                    for (local_88 = iVar1 + 2; iVar1 = local_8c, local_88 < nVars;
                        local_88 = local_88 + 1) {
                      local_84 = local_88 + 1;
                      if (local_84 < nVars) {
                        local_78 = CONCAT44(local_78._4_4_,iVar3);
                        do {
                          local_58 = CONCAT44(local_58._4_4_,
                                              1 << ((char)local_98 * '\x02' & 0x1fU) |
                                              1 << (local_84 * 2 & 0x1fU) |
                                              1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                                              1 << ((byte)((char)local_90 * '\x02') & 0x1f) |
                                              1 << ((byte)((char)local_8c * '\x02') & 0x1f) |
                                              1 << ((byte)((char)local_88 * '\x02') & 0x1f));
                          uVar5 = 1;
                          uVar4 = 0;
                          do {
                            local_50 = uVar5;
                            local_68 = uVar4;
                            if (uVar4 < 5) {
                              do {
                                local_70 = uVar5;
                                for (; uVar5 < 5; uVar5 = uVar5 + 1) {
                                  iVar3 = If_ManSatCheckXY(pSat,6,pTruth,nVars,
                                                           3 << ((char)(&local_94)[uVar5] * '\x02' &
                                                                0x1fU) | (uint)local_58 |
                                                           3 << ((char)(&local_98)[local_70] *
                                                                 '\x02' & 0x1fU) |
                                                           3 << ((char)(&local_98)[uVar4] * '\x02' &
                                                                0x1fU),(word *)0x0,(word *)0x0,vLits
                                                          );
                                  if (iVar3 != 0) {
                                    uVar9 = 3 << ((char)(&local_98)[local_70] * '\x02' & 0x1fU) |
                                            3 << ((char)(&local_98)[local_68] * '\x02' & 0x1fU);
                                    local_58._0_4_ =
                                         3 << ((char)(&local_94)[uVar5] * '\x02' & 0x1fU) |
                                         (uint)local_58;
                                    goto LAB_00434c06;
                                  }
                                  uVar4 = local_68;
                                }
                                uVar5 = local_70 + 1;
                              } while (uVar5 != 6);
                            }
                            uVar4 = uVar4 + 1;
                            uVar5 = local_50 + 1;
                          } while (uVar4 != 6);
                          local_84 = local_84 + 1;
                          iVar3 = (uint)local_78;
                        } while (local_84 < nVars);
                      }
                    }
                  }
                }
              }
              local_98 = local_98 + 1;
              iVar2 = local_98;
            } while (local_98 < nVars);
          }
          if ((3 < iVar3) && (local_98 = 0, 0 < nVars)) {
            iVar3 = 0;
            do {
              while (local_94 = iVar3 + 1, iVar3 + 1 < nVars) {
                for (local_90 = iVar3 + 2; iVar3 = local_94, iVar2 = local_90, local_90 < nVars;
                    local_90 = local_90 + 1) {
                  while (local_8c = iVar2 + 1, iVar2 + 1 < nVars) {
                    local_84 = iVar2 + 2;
                    while (local_88 = local_84, iVar2 = local_8c, local_84 < nVars) {
                      while( true ) {
                        local_84 = local_84 + 1;
                        if (nVars <= local_84) break;
                        local_78 = CONCAT44(local_78._4_4_,
                                            1 << ((char)local_98 * '\x02' & 0x1fU) |
                                            1 << (local_84 * 2 & 0x1fU) |
                                            1 << ((byte)((char)local_94 * '\x02') & 0x1f) |
                                            1 << ((byte)((char)local_90 * '\x02') & 0x1f) |
                                            1 << ((byte)((char)local_8c * '\x02') & 0x1f) |
                                            1 << ((byte)((char)local_88 * '\x02') & 0x1f));
                        local_58 = 2;
                        local_50 = 1;
                        uVar4 = 0;
                        do {
                          local_68 = local_50;
                          local_38 = local_58;
                          if (uVar4 < 5) {
                            do {
                              if (local_68 < 5) {
                                local_70 = local_38;
                                uVar5 = local_68;
                                do {
                                  iVar3 = If_ManSatCheckXY(pSat,6,pTruth,nVars,
                                                           3 << ((char)(&local_94)[uVar5] * '\x02' &
                                                                0x1fU) |
                                                           3 << ((char)(&local_98)[local_70] *
                                                                 '\x02' & 0x1fU) |
                                                           3 << ((char)(&local_98)[local_68] *
                                                                 '\x02' & 0x1fU) |
                                                           3 << ((char)(&local_98)[uVar4] * '\x02' &
                                                                0x1fU) | (uint)local_78,(word *)0x0,
                                                           (word *)0x0,vLits);
                                  if (iVar3 != 0) {
                                    return 3 << ((char)(&local_94)[uVar5] * '\x02' & 0x1fU) |
                                           3 << ((char)(&local_98)[local_70] * '\x02' & 0x1fU) |
                                           3 << ((char)(&local_98)[local_68] * '\x02' & 0x1fU) |
                                           3 << ((char)(&local_98)[uVar4] * '\x02' & 0x1fU) |
                                           (uint)local_78;
                                  }
                                  uVar5 = uVar5 + 1;
                                } while ((uVar5 < 5) ||
                                        (bVar12 = local_70 < 5, local_70 = local_70 + 1,
                                        uVar5 = local_68, bVar12));
                              }
                              local_68 = local_68 + 1;
                              local_38 = local_38 + 1;
                            } while (local_68 != 6);
                          }
                          uVar4 = uVar4 + 1;
                          local_58 = local_58 + 1;
                          local_50 = local_50 + 1;
                        } while (uVar4 != 6);
                      }
                      local_84 = local_88 + 1;
                    }
                  }
                }
              }
              local_98 = local_98 + 1;
              uVar9 = 0;
              iVar3 = local_98;
            } while (local_98 < nVars);
          }
        }
      }
    }
  }
  return uVar9;
LAB_00434404:
  cVar6 = (char)(&local_98)[lVar8];
LAB_00434412:
  return 3 << (cVar6 * '\x02' & 0x1fU) | uVar11;
}

Assistant:

unsigned If_ManSatCheckXYall_int( void * pSat, int nLutSize, word * pTruth, int nVars, Vec_Int_t * vLits )
{
    unsigned uSet = 0;
    int nTotal = 2 * nLutSize - 1;
    int nShared = nTotal - nVars;
    int i[6], s[4];
    assert( nLutSize >= 2 && nLutSize <= 6 );
    assert( nLutSize < nVars && nVars <= nTotal );
    assert( nShared >= 0 && nShared < nLutSize - 1 );
    if ( nLutSize == 2 )
    {
        assert( nShared == 0 );
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
    }
    else if ( nLutSize == 3 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
    }
    else if ( nLutSize == 4 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            {
                for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
                for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                    if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                        return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
            }
        }
    }
    else if ( nLutSize == 5 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
        }
        if ( nShared < 3 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]]));
        }
    }
    else if ( nLutSize == 6 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
        }
        if ( nShared < 3 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]]));
        }
        if ( nShared < 4 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
            for ( s[3] = s[1]+1; s[3] < nLutSize; s[3]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])) | (3 << (2*i[s[3]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])) | (3 << (2*i[s[3]]));
        }
    }
    return 0;
}